

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_resampler_set_rate
                    (ma_resampler *pResampler,ma_uint32 sampleRateIn,ma_uint32 sampleRateOut)

{
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  ma_result result;
  ma_result local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if ((in_ESI == 0) || (in_EDX == 0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else if ((in_RDI[1] == 0) || (*(long *)(in_RDI[1] + 0x20) == 0)) {
    local_4 = MA_NOT_IMPLEMENTED;
  }
  else {
    local_4 = (**(code **)(in_RDI[1] + 0x20))(in_RDI[2],*in_RDI,in_ESI,in_EDX);
    if (local_4 == MA_SUCCESS) {
      *(int *)(in_RDI + 4) = in_ESI;
      *(int *)((long)in_RDI + 0x24) = in_EDX;
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_resampler_set_rate(ma_resampler* pResampler, ma_uint32 sampleRateIn, ma_uint32 sampleRateOut)
{
    ma_result result;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (sampleRateIn == 0 || sampleRateOut == 0) {
        return MA_INVALID_ARGS;
    }

    if (pResampler->pBackendVTable == NULL || pResampler->pBackendVTable->onSetRate == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pResampler->pBackendVTable->onSetRate(pResampler->pBackendUserData, pResampler->pBackend, sampleRateIn, sampleRateOut);
    if (result != MA_SUCCESS) {
        return result;
    }

    pResampler->sampleRateIn  = sampleRateIn;
    pResampler->sampleRateOut = sampleRateOut;

    return MA_SUCCESS;
}